

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype QtPrivate::lastIndexOf
                    (QLatin1StringView haystack,qsizetype from,QStringView needle,CaseSensitivity cs
                    )

{
  char *ch;
  byte bVar1;
  bool bVar2;
  char32_t cVar3;
  long lVar4;
  QChar *pQVar5;
  ulong uVar6;
  QChar *pQVar7;
  char16_t cVar8;
  ulong uVar9;
  QChar *pQVar10;
  short sVar11;
  char16_t cVar12;
  QChar *start;
  int iVar13;
  long lVar14;
  long lVar15;
  QChar *ch_00;
  long lVar16;
  ulong uVar17;
  
  start = (QChar *)needle.m_data;
  lVar16 = needle.m_size;
  pQVar7 = (QChar *)haystack.m_data;
  uVar9 = haystack.m_size;
  if (lVar16 != 1) {
    uVar17 = (from >> 0x3f & uVar9) + from;
    if (uVar17 == uVar9 && lVar16 == 0) {
      return uVar17;
    }
    uVar6 = uVar9 - lVar16;
    if ((long)uVar6 < 0 || uVar9 < uVar17) {
      return -1;
    }
    if ((long)uVar17 < (long)uVar6) {
      uVar6 = uVar17;
    }
    ch_00 = (QChar *)((long)&pQVar7->ucs + uVar6);
    uVar9 = 0;
    if (lVar16 != 0) {
      uVar9 = lVar16 - 1;
    }
    if (cs != CaseSensitive) {
      if (lVar16 < 1) {
        lVar15 = 0;
        lVar4 = 0;
        pQVar5 = pQVar7;
      }
      else {
        pQVar10 = start + uVar9;
        lVar4 = 0;
        lVar15 = 0;
        lVar14 = lVar16;
        do {
          pQVar5 = start;
          cVar3 = (anonymous_namespace)::foldCaseHelper<QChar_const*>(pQVar10,start);
          lVar4 = (ulong)(uint)cVar3 + lVar4 * 2;
          cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            ((char *)((long)pQVar7 + lVar14 + (uVar6 - (lVar16 != 0))),
                             (char *)pQVar5);
          lVar15 = (ulong)(uint)cVar3 + lVar15 * 2;
          pQVar10 = pQVar10 + -1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      if ((long)uVar17 < 0) {
        return -1;
      }
      cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>((char *)ch_00,(char *)pQVar5);
      lVar15 = lVar15 - (ulong)(uint)cVar3;
      do {
        ch = (char *)((long)&pQVar7->ucs + uVar6);
        cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>(ch,(char *)pQVar5);
        lVar15 = (ulong)(uint)cVar3 + lVar15;
        if ((lVar15 == lVar4) &&
           (pQVar5 = start, iVar13 = ucstricmp(lVar16,(char16_t *)start,lVar16,ch), iVar13 == 0)) {
          return uVar6;
        }
        if (uVar9 < 0x40) {
          cVar3 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            ((char *)((long)pQVar7 + uVar6 + lVar16 + -1),(char *)pQVar5);
          lVar15 = lVar15 - ((ulong)(uint)cVar3 << ((byte)uVar9 & 0x3f));
        }
        lVar15 = lVar15 * 2;
        lVar14 = uVar6 - 1;
        uVar6 = uVar6 - 1;
      } while (pQVar7 <= (QChar *)((long)pQVar7 + lVar14));
      return -1;
    }
    if (lVar16 < 1) {
      lVar15 = 0;
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      lVar15 = 0;
      lVar14 = lVar16;
      do {
        lVar4 = (ulong)*(ushort *)((long)start + (lVar14 * 2 - (ulong)((uint)(lVar16 != 0) * 2))) +
                lVar4 * 2;
        lVar15 = (ulong)*(byte *)((long)pQVar7 + lVar14 + (uVar6 - (lVar16 != 0))) + lVar15 * 2;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    if ((long)uVar17 < 0) {
      return -1;
    }
    lVar15 = lVar15 - (ulong)(byte)ch_00->ucs;
    do {
      lVar15 = (ulong)(byte)ch_00->ucs + lVar15;
      pQVar5 = start;
      pQVar10 = ch_00;
      if (lVar15 == lVar4) {
        do {
          if (start + lVar16 <= pQVar5) {
            iVar13 = 0;
            break;
          }
          iVar13 = (uint)(ushort)pQVar5->ucs - (uint)(byte)pQVar10->ucs;
          pQVar5 = pQVar5 + 1;
          pQVar10 = (QChar *)((long)&pQVar10->ucs + 1);
        } while (iVar13 == 0);
        if (iVar13 == 0) {
          return (long)ch_00 - (long)pQVar7;
        }
      }
      ch_00 = (QChar *)((long)&ch_00[-1].ucs + 1);
      if (uVar9 < 0x40) {
        lVar15 = lVar15 - ((ulong)*(byte *)((long)&ch_00->ucs + lVar16) << ((byte)uVar9 & 0x3f));
      }
      lVar15 = lVar15 * 2;
      if (ch_00 < pQVar7) {
        return -1;
      }
    } while( true );
  }
  if (uVar9 == 0) {
    return -1;
  }
  lVar16 = uVar9 - 1;
  if ((ulong)from <= uVar9) {
    lVar16 = from;
  }
  if (from < 0) {
    lVar16 = from + uVar9;
  }
  if (lVar16 < 0) {
    return -1;
  }
  cVar12 = start->ucs;
  if (cs == CaseSensitive) {
    do {
      if (cVar12 == (ushort)*(byte *)((long)&pQVar7->ucs + lVar16)) goto LAB_0033a1b0;
      lVar4 = lVar16 + -1;
      lVar16 = lVar16 + -1;
    } while (pQVar7 <= (QChar *)((long)pQVar7 + lVar4));
  }
  else {
    sVar11 = (short)((uint)(int)(short)*(ushort *)
                                        (QUnicodeTables::uc_properties +
                                        (ulong)*(ushort *)
                                                (QUnicodeTables::uc_property_trie +
                                                (ulong)(((ushort)cVar12 & 0x1f) +
                                                       (uint)*(ushort *)
                                                              (QUnicodeTables::uc_property_trie +
                                                              (ulong)((ushort)cVar12 >> 5) * 2)) * 2
                                                ) * 0x14 + 0xe) >> 1);
    if ((*(ushort *)
          (QUnicodeTables::uc_properties +
          (ulong)*(ushort *)
                  (QUnicodeTables::uc_property_trie +
                  (ulong)(((ushort)cVar12 & 0x1f) +
                         (uint)*(ushort *)
                                (QUnicodeTables::uc_property_trie + (ulong)((ushort)cVar12 >> 5) * 2
                                )) * 2) * 0x14 + 0xe) & 1) == 0) {
      cVar12 = sVar11 + cVar12;
    }
    else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2) == 1) {
      cVar12 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2 + 2);
    }
    do {
      bVar1 = *(byte *)((long)&pQVar7->ucs + lVar16);
      cVar8 = (char16_t)bVar1;
      sVar11 = (short)((uint)(int)(short)*(ushort *)
                                          (QUnicodeTables::uc_properties +
                                          (ulong)*(ushort *)
                                                  (QUnicodeTables::uc_property_trie +
                                                  (ulong)((bVar1 & 0x1f) +
                                                         (uint)*(ushort *)
                                                                (QUnicodeTables::uc_property_trie +
                                                                (ulong)(bVar1 >> 5) * 2)) * 2) *
                                          0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)((bVar1 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) * 2)
            * 0x14 + 0xe) & 1) == 0) {
        cVar8 = (ushort)bVar1 + sVar11;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2) == 1) {
        cVar8 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2 + 2);
      }
      if (cVar8 == cVar12) goto LAB_0033a1b0;
      lVar4 = lVar16 + -1;
      lVar16 = lVar16 + -1;
    } while (pQVar7 <= (QChar *)((long)pQVar7 + lVar4));
  }
  bVar2 = true;
LAB_0033a1b2:
  if (bVar2) {
    return -1;
  }
  return lVar16;
LAB_0033a1b0:
  bVar2 = false;
  goto LAB_0033a1b2;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QLatin1StringView haystack, qsizetype from, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}